

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo6.cpp
# Opt level: O3

void intrin(state *s)

{
  int iVar1;
  uint *elem;
  rep rVar2;
  pointer puVar3;
  long lVar4;
  scope scope;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  srand(s->_iterations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_38,(long)s->_iterations);
  if (0 < s->_iterations) {
    iVar5 = 0;
    do {
      iVar1 = rand();
      local_3c = iVar1 + 1;
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_38,
                   (iterator)
                   local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_3c);
      }
      else {
        *local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_3c;
        local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < s->_iterations);
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  (s->_start).__d.__r = rVar2;
  uVar7 = 0;
  puVar3 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      uVar6 = 0x1f;
      if (*puVar3 != 0) {
        for (; *puVar3 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = ((int)uVar7 - (uVar6 ^ 0x1f)) + 0x20;
      uVar7 = (ulong)uVar6;
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    uVar7 = (ulong)(int)uVar6;
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  s->_duration_ns = lVar4 - (s->_start).__d.__r;
  s->_result = uVar7;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void intrin(picobench::state& s)
{
    std::vector<uint32_t> v;
    srand(s.iterations());
    v.reserve(s.iterations());

    for (int i = 0; i<s.iterations(); ++i) {
        v.push_back(rand() + 1);
    }

    int sum = 0;

    {
        picobench::scope scope(s);
        for (const auto& elem : v) {
            sum += count_bits(elem);
        }
    }

    s.set_result(sum);
}